

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O0

bool splitFilePath(string *path,string *directory,string *basename,string *field)

{
  bool bVar1;
  bool bVar2;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [8];
  string file;
  int lastSlash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string jsonPath;
  undefined1 local_c8 [4];
  int last_;
  string local_a8 [32];
  string local_88 [32];
  int local_68;
  int lastSlash_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  string *psStack_30;
  int size;
  string *field_local;
  string *basename_local;
  string *directory_local;
  string *path_local;
  
  psStack_30 = field;
  field_local = basename;
  basename_local = directory;
  directory_local = path;
  bVar1 = fileExists(path);
  if (bVar1) {
    local_34 = std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_58,(ulong)directory_local);
    bVar1 = std::operator==(&local_58,".json");
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      local_68 = std::__cxx11::string::find_last_of((char *)directory_local,0x15d035);
      if (local_68 == -1) {
        std::__cxx11::string::operator=((string *)basename_local,".");
      }
      else {
        std::__cxx11::string::substr((ulong)local_88,(ulong)directory_local);
        std::__cxx11::string::operator=((string *)basename_local,local_88);
        std::__cxx11::string::~string(local_88);
      }
      std::__cxx11::string::substr((ulong)local_a8,(ulong)directory_local);
      std::__cxx11::string::operator=((string *)field_local,local_a8);
      std::__cxx11::string::~string(local_a8);
      path_local._7_1_ = 1;
    }
    else if (local_34 < 7) {
      path_local._7_1_ = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_c8,(ulong)directory_local);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,".dat");
      std::__cxx11::string::~string((string *)local_c8);
      if (bVar1) {
        path_local._7_1_ = 0;
      }
      else {
        jsonPath.field_2._12_4_ =
             std::__cxx11::string::find_last_of((char *)directory_local,0x15d03d);
        if ((jsonPath.field_2._12_4_ == -1) || (local_34 + -6 < (int)jsonPath.field_2._12_4_)) {
          path_local._7_1_ = 0;
        }
        else {
          std::__cxx11::string::string((string *)local_f0);
          do {
            std::__cxx11::string::substr((ulong)&lastSlash,(ulong)directory_local);
            std::operator+(&local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &lastSlash,".json");
            std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&lastSlash);
            bVar2 = fileExists((string *)local_f0);
            bVar1 = false;
            if (!bVar2) {
              jsonPath.field_2._12_4_ =
                   std::__cxx11::string::find_last_of((char *)directory_local,0x15d03d);
              bVar1 = jsonPath.field_2._12_4_ != -1;
            }
          } while (bVar1);
          if (jsonPath.field_2._12_4_ == -1) {
            path_local._7_1_ = 0;
            file.field_2._12_4_ = 1;
          }
          else {
            file.field_2._8_4_ =
                 std::__cxx11::string::find_last_of((char *)directory_local,0x15d035);
            std::__cxx11::string::string(local_158);
            if (file.field_2._8_4_ == -1) {
              std::__cxx11::string::operator=((string *)basename_local,".");
              std::__cxx11::string::operator=(local_158,(string *)directory_local);
            }
            else {
              std::__cxx11::string::substr((ulong)local_178,(ulong)directory_local);
              std::__cxx11::string::operator=((string *)basename_local,local_178);
              std::__cxx11::string::~string(local_178);
              std::__cxx11::string::substr((ulong)local_198,(ulong)directory_local);
              std::__cxx11::string::operator=(local_158,local_198);
              std::__cxx11::string::~string(local_198);
            }
            std::__cxx11::string::substr((ulong)local_1b8,(ulong)directory_local);
            std::__cxx11::string::operator=((string *)field_local,local_1b8);
            std::__cxx11::string::~string(local_1b8);
            std::__cxx11::string::substr((ulong)local_1d8,(ulong)directory_local);
            std::__cxx11::string::operator=((string *)psStack_30,local_1d8);
            std::__cxx11::string::~string(local_1d8);
            path_local._7_1_ = 1;
            file.field_2._12_4_ = 1;
            std::__cxx11::string::~string(local_158);
          }
          std::__cxx11::string::~string((string *)local_f0);
        }
      }
    }
  }
  else {
    path_local._7_1_ = 0;
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool splitFilePath(const std::string& path, std::string& directory, std::string& basename, std::string& field)
{
	if (!fileExists(path))
	{
		return false;
	}

	int size = path.length();

	if (path.substr(size - 5, 5) == ".json")
	{
		int lastSlash = path.find_last_of("/\\");

		if (lastSlash == std::string::npos)
			directory = ".";
		else
			directory = path.substr(0, lastSlash);

		basename = path.substr(lastSlash + 1, size - lastSlash - 6);

		return true;
	}


	if (size < 7)
	{
		return false;
	}

	if (path.substr(size - 4, 4) != ".dat")
	{
		return false;
	}

	int last_ = path.find_last_of("_");
	if (last_ == std::string::npos || last_ > size - 6)
	{
		return false;
	}

	std::string jsonPath;
	do
	{
		jsonPath = path.substr(0, last_) + ".json";
	}
	while (!fileExists(jsonPath) && (last_ = path.find_last_of("_", last_ - 1)) != std::string::npos);

	if (last_ == std::string::npos)
	{
		return false;
	}

	int lastSlash = path.find_last_of("/\\");
	std::string file;

	if (lastSlash == std::string::npos)
	{
		directory = ".";
		file = path;
	}
	else
	{
		directory = path.substr(0, lastSlash);
		file = path.substr(lastSlash + 1);
	}

	basename = path.substr(lastSlash + 1, (last_ - lastSlash) - 1);
	field = path.substr(last_ + 1, size - last_ - 5);

	return true;
}